

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * vera::packSprite(Image *__return_storage_ptr__,
                        vector<vera::Image,_std::allocator<vera::Image>_> *_images)

{
  pointer pIVar1;
  pointer ptVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  thread *t_1;
  pointer ptVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  long *local_78;
  long local_70;
  long local_68;
  thread t;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  Image::Image(__return_storage_ptr__);
  pIVar1 = (_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
      super__Vector_impl_data._M_finish != pIVar1) {
    iVar3 = (*pIVar1->_vptr_Image[6])();
    iVar4 = (*((_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
               super__Vector_impl_data._M_start)->_vptr_Image[7])();
    iVar5 = (*((_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
               super__Vector_impl_data._M_start)->_vptr_Image[8])();
    local_68 = (long)iVar3;
    local_70 = (long)iVar4;
    fVar14 = ceilf(SQRT((float)(ulong)(((long)(_images->
                                              super__Vector_base<vera::Image,_std::allocator<vera::Image>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(_images->
                                             super__Vector_base<vera::Image,_std::allocator<vera::Image>_>
                                             )._M_impl.super__Vector_impl_data._M_start) / 0x70)));
    uVar9 = (long)(fVar14 - 9.223372e+18) & (long)fVar14 >> 0x3f | (long)fVar14;
    Image::allocate(__return_storage_ptr__,uVar9 * local_68,uVar9 * local_70,(long)iVar5);
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3 = std::thread::hardware_concurrency();
    uVar6 = ((long)(_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
                  super__Vector_impl_data._M_start) / 0x70;
    uVar13 = (ulong)iVar3;
    uVar7 = uVar6 / uVar13;
    for (uVar12 = 0;
        ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,
        ptVar10 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start, uVar13 != uVar12; uVar12 = uVar12 + 1) {
      t._M_id._M_thread = (id)0;
      local_78 = (long *)operator_new(0x40);
      lVar8 = uVar12 * uVar7;
      uVar11 = 0;
      if ((long)(iVar3 + -1) == uVar12) {
        uVar11 = uVar6 % uVar13;
      }
      *local_78 = (long)&PTR___State_003de590;
      local_78[1] = (long)_images;
      local_78[2] = (long)__return_storage_ptr__;
      local_78[3] = lVar8;
      local_78[4] = uVar11 + lVar8 + uVar7;
      local_78[5] = local_68;
      local_78[6] = local_70;
      local_78[7] = uVar9;
      std::thread::_M_start_thread(&t,&local_78,0);
      if (local_78 != (long *)0x0) {
        (**(code **)(*local_78 + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>(&threads,&t)
      ;
      std::thread::~thread(&t);
    }
    for (; ptVar10 != ptVar2; ptVar10 = ptVar10 + 1) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  }
  return __return_storage_ptr__;
}

Assistant:

Image packSprite( const std::vector<Image>& _images ) {
    Image out;

    if (_images.size() == 0)
        return out;

    // Let's asume they are all equal
    size_t layerWidth = _images[0].getWidth();
    size_t layerHeight = _images[0].getHeight();
    size_t layerChannels = _images[0].getChannels();

    size_t layers_per_side = std::ceil( std::sqrt( float(_images.size()) ));
    size_t width = layerWidth * layers_per_side;
    size_t height = layerHeight * layers_per_side;
    size_t channels = layerChannels;

    out.allocate(width, height, channels);

    std::vector<std::thread> threads;
    const int nThreads = std::thread::hardware_concurrency();
    size_t layersPerThread = _images.size() / nThreads;
    size_t layersLeftOver = _images.size() % nThreads;
    for (size_t i = 0; i < nThreads; ++i) {
        size_t start_layer = i * layersPerThread;
        size_t end_layer = start_layer + layersPerThread;
        if (i == nThreads - 1)
            end_layer = start_layer + layersPerThread + layersLeftOver;

        std::thread t(
            [&_images, &out, start_layer, end_layer, layerWidth, layerHeight, layers_per_side ]() {
                for (size_t z = start_layer; z < end_layer; z++)
                for (size_t y = 0; y < layerHeight; y++)
                for (size_t x = 0; x < layerWidth; x++) {
                    size_t layerX = (z % layers_per_side) * layerWidth; 
                    size_t layerY = floor(z / layers_per_side) * layerHeight;
                    out.setColor(   out.getIndex(layerX + x, layerY + y), 
                                    _images[z].getColor( _images[z].getIndex(x, y) ));
                }
            }
        );
        threads.push_back(std::move(t));
    }

    for (std::thread& t : threads)
        t.join();

    return out;
}